

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,RegexFlags *flags)

{
  StandardChars<unsigned_char> *pSVar1;
  EncodedChar EVar2;
  bool bVar3;
  EncodedChar EVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ScriptConfiguration *pSVar9;
  Char local_22;
  uint32 n;
  Char c;
  CharCount consume;
  EncodedChar ec;
  RegexFlags *flags_local;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  do {
    EVar2 = ECLookahead(this,0);
    if (EVar2 == '\0') {
      return;
    }
    if (((EVar2 == '\\') && (bVar3 = ECCanConsume(this,6), bVar3)) &&
       (EVar4 = ECLookahead(this,1), EVar4 == 'u')) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,2);
      bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
      if (!bVar3) goto LAB_015ba186;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,3);
      bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
      if (!bVar3) goto LAB_015ba186;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,4);
      bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
      if (!bVar3) goto LAB_015ba186;
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,5);
      bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
      if (!bVar3) goto LAB_015ba186;
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar9);
      if (bVar3) {
        Fail(this,-0x7ff5ec67);
        return;
      }
      pSVar1 = this->standardEncodedChars;
      EVar2 = ECLookahead(this,2);
      uVar5 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar2);
      pSVar1 = this->standardEncodedChars;
      EVar2 = ECLookahead(this,3);
      uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar2);
      pSVar1 = this->standardEncodedChars;
      EVar2 = ECLookahead(this,4);
      uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar2);
      pSVar1 = this->standardEncodedChars;
      EVar2 = ECLookahead(this,5);
      uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar2);
      local_22 = Chars<char16_t>::UTC(uVar5 << 0xc | uVar6 << 8 | uVar7 << 4 | uVar8);
      n = 6;
    }
    else {
LAB_015ba186:
      local_22 = Chars<unsigned_char>::CTW(EVar2);
      n = 1;
    }
    switch(local_22) {
    case L'g':
      if ((*flags & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | GlobalRegexFlag;
      break;
    default:
      goto switchD_015ba1ca_caseD_68;
    case L'i':
      if ((*flags & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | IgnoreCaseRegexFlag;
      break;
    case L'm':
      if ((*flags & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | MultilineRegexFlag;
      break;
    case L's':
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar3 = Js::ScriptConfiguration::IsES2018RegExDotAllEnabled(pSVar9);
      if (!bVar3) goto switchD_015ba1ca_caseD_75;
      if ((*flags & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | DotAllRegexFlag;
      break;
    case L'u':
switchD_015ba1ca_caseD_75:
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar9);
      if (!bVar3) goto switchD_015ba1ca_caseD_79;
      if ((*flags & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | UnicodeRegexFlag;
      break;
    case L'y':
switchD_015ba1ca_caseD_79:
      pSVar9 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar3 = Js::ScriptConfiguration::IsES6RegExStickyEnabled(pSVar9);
      if (!bVar3) {
switchD_015ba1ca_caseD_68:
        bVar3 = StandardChars<char16_t>::IsWord(this->standardChars,local_22);
        if (!bVar3) {
          return;
        }
        Fail(this,-0x7ff5ec67);
        return;
      }
      if ((*flags & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
      }
      *flags = *flags | StickyRegexFlag;
    }
    ECConsume(this,n);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }